

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_static.c
# Opt level: O1

uchar * rans_compress_O1(uchar *in,uint in_size,uint *out_size)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  short sVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uchar *puVar17;
  ulong uVar18;
  uchar *puVar19;
  byte *pbVar20;
  ulong uVar21;
  long lVar22;
  uchar *puVar23;
  ulong uVar24;
  undefined1 *puVar25;
  undefined1 *puVar26;
  short sVar27;
  long lVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  int *piVar32;
  uint *puVar33;
  size_t __n;
  int iVar34;
  uint uVar35;
  uint uVar36;
  byte *pbVar37;
  ulong uVar38;
  uint *puVar39;
  uint uVar40;
  uint uVar41;
  int iVar42;
  int iVar43;
  uint uVar44;
  undefined1 *__s;
  long lVar45;
  byte bVar46;
  uint uVar47;
  double dVar48;
  double dVar49;
  int T [256];
  int F [256] [256];
  RansEncSymbol syms [256] [256];
  byte bVar50;
  uint uVar51;
  
  if (in_size < 4) {
    puVar17 = rans_compress_O0(in,in_size,out_size);
    return puVar17;
  }
  dVar49 = (double)in_size * 1.05;
  dVar48 = dVar49 + 198147.0 + 9.0;
  uVar18 = (ulong)dVar48;
  puVar17 = (uchar *)malloc((long)(dVar48 - 9.223372036854776e+18) & (long)uVar18 >> 0x3f | uVar18);
  if (puVar17 == (uchar *)0x0) {
    return (uchar *)0x0;
  }
  puVar19 = puVar17 + (long)(int)dVar49 + 0x3060c;
  __s = &stack0xffffffffffebffc8;
  uVar24 = 0;
  memset(__s,0,0x40000);
  memset(&stack0xffffffffffebfbc8,0,0x400);
  uVar18 = 0;
  do {
    bVar46 = in[uVar24];
    *(int *)(&stack0xffffffffffebfbc8 + uVar18 * 4) =
         *(int *)(&stack0xffffffffffebfbc8 + uVar18 * 4) + 1;
    *(int *)(&stack0xffffffffffebffc8 + (ulong)bVar46 * 4 + uVar18 * 0x400) =
         *(int *)(&stack0xffffffffffebffc8 + (ulong)bVar46 * 4 + uVar18 * 0x400) + 1;
    uVar24 = uVar24 + 1;
    uVar18 = (ulong)bVar46;
  } while (in_size != uVar24);
  uVar18 = (ulong)(in_size >> 2);
  *(int *)(&stack0xffffffffffebffc8 + (ulong)in[uVar18] * 4) =
       *(int *)(&stack0xffffffffffebffc8 + (ulong)in[uVar18] * 4) + 1;
  *(int *)(&stack0xffffffffffebffc8 + (ulong)in[uVar18 * 2] * 4) =
       *(int *)(&stack0xffffffffffebffc8 + (ulong)in[uVar18 * 2] * 4) + 1;
  *(int *)(&stack0xffffffffffebffc8 + (ulong)in[uVar18 * 3] * 4) =
       *(int *)(&stack0xffffffffffebffc8 + (ulong)in[uVar18 * 3] * 4) + 1;
  pbVar20 = puVar17 + 9;
  lVar28 = 0;
  uVar24 = 1;
  puVar26 = &stack0xffffffffffebffcc;
  iVar34 = 0;
  do {
    iVar43 = *(int *)(&stack0xffffffffffebfbc8 + lVar28 * 4);
    if (iVar43 != 0) {
      uVar21 = 0;
      iVar14 = 0;
      iVar42 = 0;
      uVar38 = 0;
      do {
        iVar29 = *(int *)(__s + uVar21 * 4);
        if (iVar29 != 0) {
          if (iVar42 < iVar29) {
            uVar38 = uVar21 & 0xffffffff;
          }
          if (iVar42 <= iVar29) {
            iVar42 = iVar29;
          }
          iVar29 = (int)((double)iVar29 * (4096.0 / (double)iVar43));
          iVar29 = iVar29 + (uint)(iVar29 == 0);
          *(int *)(__s + uVar21 * 4) = iVar29;
          iVar14 = iVar14 + iVar29;
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != 0x100);
      lVar22 = lVar28 * 0x400;
      *(int *)(&stack0xffffffffffebffc8 + (long)(int)uVar38 * 4 + lVar22) =
           (*(int *)(&stack0xffffffffffebffc8 + (long)(int)uVar38 * 4 + lVar22) - iVar14) + 0xfff;
      if (iVar34 == 0) {
        *pbVar20 = (byte)lVar28;
        iVar34 = 0;
        pbVar37 = pbVar20 + 1;
        if ((lVar28 != 0) && (*(int *)(&stack0xffffffffffebfbc4 + lVar28 * 4) != 0)) {
          uVar38 = lVar28 + 1U & 0xffffffff;
          uVar21 = uVar24;
          if (lVar28 != 0xff) {
            do {
              uVar38 = uVar21;
              if (*(int *)(&stack0xffffffffffebfbc8 + uVar38 * 4) == 0) goto LAB_00137b1e;
              uVar21 = uVar38 + 1;
            } while (uVar38 + 1 != 0x100);
            uVar38 = 0x100;
          }
LAB_00137b1e:
          iVar34 = (int)uVar38 - (int)(lVar28 + 1U);
          pbVar20[1] = (byte)iVar34;
          pbVar37 = pbVar20 + 2;
        }
      }
      else {
        iVar34 = iVar34 + -1;
        pbVar37 = pbVar20;
      }
      uVar21 = 0;
      iVar42 = -1;
      iVar43 = 0;
      uVar47 = 0;
      puVar25 = puVar26;
      do {
        if (*(int *)(&stack0xffffffffffebffc8 + uVar21 * 4 + lVar22) != 0) {
          if (iVar43 == 0) {
            *pbVar37 = (byte)uVar21;
            iVar43 = 0;
            pbVar20 = pbVar37 + 1;
            if ((uVar21 != 0) && (*(int *)(&stack0xffffffffffebffc4 + uVar21 * 4 + lVar22) != 0)) {
              iVar14 = (int)uVar21 + 1;
              iVar43 = iVar14;
              if (uVar21 < 0xff) {
                lVar45 = 0;
                do {
                  if (*(int *)(puVar25 + lVar45 * 4) == 0) {
                    iVar43 = (int)lVar45 - iVar42;
                    goto LAB_00137a83;
                  }
                  lVar1 = uVar21 + lVar45;
                  lVar45 = lVar45 + 1;
                } while (lVar1 != 0xfe);
                iVar43 = 0x100;
              }
LAB_00137a83:
              iVar43 = iVar43 - iVar14;
              pbVar37[1] = (byte)iVar43;
              pbVar20 = pbVar37 + 2;
            }
          }
          else {
            iVar43 = iVar43 + -1;
            pbVar20 = pbVar37;
          }
          iVar14 = *(int *)(&stack0xffffffffffebffc8 + uVar21 * 4 + lVar22);
          lVar45 = 1;
          pbVar37 = pbVar20;
          if (0x7f < iVar14) {
            *pbVar20 = (byte)((uint)iVar14 >> 8) | 0x80;
            iVar14 = *(int *)(&stack0xffffffffffebffc8 + uVar21 * 4 + lVar22);
            lVar45 = 2;
            pbVar37 = pbVar20 + 1;
          }
          *pbVar37 = (byte)iVar14;
          if (0x1000 < uVar47) {
            __assert_fail("start <= (1u << scale_bits)",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                          ,0xba,
                          "void RansEncSymbolInit(RansEncSymbol *, uint32_t, uint32_t, uint32_t)");
          }
          uVar15 = *(uint *)(&stack0xffffffffffebffc8 + uVar21 * 4 + lVar22);
          if (0x1000 - uVar47 < uVar15) {
            __assert_fail("freq <= (1u << scale_bits) - start",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                          ,0xbb,
                          "void RansEncSymbolInit(RansEncSymbol *, uint32_t, uint32_t, uint32_t)");
          }
          piVar32 = (int *)(&stack0xffffffffffefffc8 + uVar21 * 0x10 + lVar28 * 0x1000);
          *piVar32 = uVar15 << 0x13;
          *(short *)(piVar32 + 3) = 0x1000 - (short)uVar15;
          if (uVar15 < 2) {
            piVar32[1] = -1;
            *(undefined2 *)((long)piVar32 + 0xe) = 0;
            uVar30 = uVar47 + 0xfff;
          }
          else {
            sVar13 = 0x1e;
            do {
              sVar27 = sVar13;
              sVar13 = sVar27 + 1;
            } while ((uint)(1 << ((char)sVar27 - 0x1eU & 0x1f)) < uVar15);
            piVar32[1] = (int)((((1L << ((byte)(sVar27 + 1) & 0x3f)) + (ulong)uVar15) - 1) /
                              (ulong)uVar15);
            *(short *)((long)piVar32 + 0xe) = sVar27 + -0x1f;
            uVar30 = uVar47;
          }
          piVar32[2] = uVar30;
          *(short *)((long)piVar32 + 0xe) = *(short *)((long)piVar32 + 0xe) + 0x20;
          pbVar37 = pbVar20 + lVar45;
          uVar47 = uVar15 + uVar47;
        }
        uVar21 = uVar21 + 1;
        iVar42 = iVar42 + -1;
        puVar25 = puVar25 + 4;
      } while (uVar21 != 0x100);
      *pbVar37 = 0;
      pbVar20 = pbVar37 + 1;
    }
    lVar28 = lVar28 + 1;
    uVar24 = uVar24 + 1;
    __s = __s + 0x400;
    puVar26 = puVar26 + 0x400;
  } while (lVar28 != 0x100);
  *pbVar20 = 0;
  pbVar20 = pbVar20 + (1 - (long)puVar17);
  if (0x30602 < (uint)pbVar20) {
    __assert_fail("tab_size < 257*257*3",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_static.c"
                  ,0x1dd,
                  "unsigned char *rans_compress_O1(unsigned char *, unsigned int, unsigned int *)");
  }
  iVar34 = (in_size & 0xfffffffc) - 2;
  bVar46 = in[uVar18 - 1];
  uVar41 = (uint)in[uVar18 * 2 + -1];
  iVar43 = (int)(uVar18 * 3);
  uVar36 = (uint)in[(long)iVar43 + -1];
  uVar30 = (uint)in[in_size - 1];
  uVar15 = in_size - 2;
  uVar47 = 0x800000;
  puVar23 = puVar19;
  if (iVar34 < (int)uVar15) {
    uVar40 = 0x800000;
    uVar16 = uVar30;
    do {
      bVar50 = in[uVar15];
      uVar30 = (uint)bVar50;
      uVar44 = *(uint *)(&stack0xffffffffffefffc8 + (ulong)(uVar16 << 4) + (ulong)bVar50 * 0x1000);
      if (uVar44 == 0) goto LAB_001380e2;
      for (; uVar44 <= uVar40; uVar40 = uVar40 >> 8) {
        puVar23[-1] = (uchar)uVar40;
        puVar23 = puVar23 + -1;
      }
      lVar28 = (ulong)(uVar16 << 4) + (ulong)bVar50 * 0x1000;
      uVar40 = (uint)*(ushort *)(&stack0xffffffffffefffd4 + lVar28) *
               (int)((ulong)*(uint *)(&stack0xffffffffffefffcc + lVar28) * (ulong)uVar40 >>
                    ((&stack0xffffffffffefffd6)[lVar28] & 0x3f)) +
               uVar40 + *(int *)(&stack0xffffffffffefffd0 + lVar28);
      uVar15 = uVar15 - 1;
      uVar16 = (uint)bVar50;
    } while (iVar34 < (int)uVar15);
  }
  else {
    uVar40 = 0x800000;
  }
  if (in_size < 8) {
    uVar15 = 0x800000;
    uVar16 = 0x800000;
  }
  else {
    lVar45 = (long)(int)uVar15;
    lVar22 = (long)(iVar43 + -2);
    lVar28 = (ulong)(in_size >> 2) * 2 + -2;
    uVar16 = 0x800000;
    uVar15 = 0x800000;
    uVar47 = 0x800000;
    uVar44 = uVar30;
    uVar35 = uVar36;
    uVar31 = uVar41;
    bVar50 = bVar46;
    uVar51 = (in_size >> 2) - 2;
    do {
      bVar2 = in[lVar45];
      uVar30 = (uint)bVar2;
      uVar7 = *(uint *)(&stack0xffffffffffefffc8 + (ulong)(uVar44 << 4) + (ulong)bVar2 * 0x1000);
      if (uVar7 == 0) goto LAB_001380e2;
      bVar3 = in[lVar22];
      uVar36 = (uint)bVar3;
      bVar4 = in[lVar28];
      uVar41 = (uint)bVar4;
      bVar46 = in[uVar51];
      for (; uVar7 <= uVar40; uVar40 = uVar40 >> 8) {
        puVar23[-1] = (uchar)uVar40;
        puVar23 = puVar23 + -1;
      }
      lVar1 = (ulong)(uVar44 << 4) + (ulong)bVar2 * 0x1000;
      uVar44 = *(uint *)(&stack0xffffffffffefffcc + lVar1);
      bVar2 = (&stack0xffffffffffefffd6)[lVar1];
      puVar39 = (uint *)(&stack0xffffffffffefffc8 + (ulong)(uVar35 << 4) + (ulong)bVar3 * 0x1000);
      uVar35 = *puVar39;
      if (uVar35 == 0) goto LAB_001380e2;
      iVar34 = *(int *)(&stack0xffffffffffefffd0 + lVar1);
      uVar5 = *(ushort *)(&stack0xffffffffffefffd4 + lVar1);
      for (; uVar35 <= uVar16; uVar16 = uVar16 >> 8) {
        puVar23[-1] = (uchar)uVar16;
        puVar23 = puVar23 + -1;
      }
      uVar35 = puVar39[1];
      bVar3 = *(byte *)((long)puVar39 + 0xe);
      puVar33 = (uint *)(&stack0xffffffffffefffc8 + (ulong)(uVar31 << 4) + (ulong)bVar4 * 0x1000);
      uVar31 = *puVar33;
      if (uVar31 == 0) goto LAB_001380e2;
      uVar7 = puVar39[2];
      uVar11 = puVar39[3];
      for (; uVar31 <= uVar15; uVar15 = uVar15 >> 8) {
        puVar23[-1] = (uchar)uVar15;
        puVar23 = puVar23 + -1;
      }
      uVar31 = puVar33[1];
      bVar4 = *(byte *)((long)puVar33 + 0xe);
      puVar39 = (uint *)(&stack0xffffffffffefffc8 + (ulong)bVar50 * 0x10 + (ulong)bVar46 * 0x1000);
      uVar8 = *puVar39;
      if (uVar8 == 0) goto LAB_001380e2;
      uVar9 = puVar33[2];
      uVar12 = puVar33[3];
      for (; uVar8 <= uVar47; uVar47 = uVar47 >> 8) {
        puVar23[-1] = (uchar)uVar47;
        puVar23 = puVar23 + -1;
      }
      uVar40 = uVar40 + iVar34 +
               (int)((ulong)uVar44 * (ulong)uVar40 >> (bVar2 & 0x3f)) * (uint)uVar5;
      uVar16 = uVar16 + uVar7 +
               (int)((ulong)uVar35 * (ulong)uVar16 >> (bVar3 & 0x3f)) * (uint)(ushort)uVar11;
      uVar15 = uVar15 + uVar9 +
               (int)((ulong)uVar31 * (ulong)uVar15 >> (bVar4 & 0x3f)) * (uint)(ushort)uVar12;
      uVar47 = uVar47 + puVar39[2] +
               (uint)(ushort)puVar39[3] *
               (int)((ulong)puVar39[1] * (ulong)uVar47 >> (*(byte *)((long)puVar39 + 0xe) & 0x3f));
      lVar28 = lVar28 + -1;
      lVar22 = lVar22 + -1;
      lVar45 = lVar45 + -1;
      bVar10 = 0 < (int)uVar51;
      uVar44 = uVar30;
      uVar35 = uVar36;
      uVar31 = uVar41;
      bVar50 = bVar46;
      uVar51 = uVar51 - 1;
    } while (bVar10);
  }
  uVar30 = uVar30 << 4;
  uVar44 = *(uint *)(&stack0xffffffffffefffc8 + uVar30);
  if (uVar44 != 0) {
    for (; uVar44 <= uVar40; uVar40 = uVar40 >> 8) {
      puVar23[-1] = (uchar)uVar40;
      puVar23 = puVar23 + -1;
    }
    uVar44 = *(uint *)(&stack0xffffffffffefffcc + uVar30);
    bVar50 = (&stack0xffffffffffefffd6)[uVar30];
    uVar36 = uVar36 << 4;
    uVar35 = *(uint *)(&stack0xffffffffffefffc8 + uVar36);
    if (uVar35 != 0) {
      iVar34 = *(int *)(&stack0xffffffffffefffd0 + uVar30);
      uVar5 = *(ushort *)(&stack0xffffffffffefffd4 + uVar30);
      for (; uVar35 <= uVar16; uVar16 = uVar16 >> 8) {
        puVar23[-1] = (uchar)uVar16;
        puVar23 = puVar23 + -1;
      }
      uVar30 = *(uint *)(&stack0xffffffffffefffcc + uVar36);
      bVar2 = (&stack0xffffffffffefffd6)[uVar36];
      uVar41 = uVar41 << 4;
      uVar35 = *(uint *)(&stack0xffffffffffefffc8 + uVar41);
      if (uVar35 != 0) {
        iVar43 = *(int *)(&stack0xffffffffffefffd0 + uVar36);
        uVar6 = *(ushort *)(&stack0xffffffffffefffd4 + uVar36);
        for (; uVar35 <= uVar15; uVar15 = uVar15 >> 8) {
          puVar23[-1] = (uchar)uVar15;
          puVar23 = puVar23 + -1;
        }
        lVar28 = (ulong)bVar46 * 0x10;
        uVar36 = *(uint *)(&stack0xffffffffffefffc8 + lVar28);
        if (uVar36 != 0) {
          iVar42 = (uint)*(ushort *)(&stack0xffffffffffefffd4 + uVar41) *
                   (int)((ulong)*(uint *)(&stack0xffffffffffefffcc + uVar41) * (ulong)uVar15 >>
                        ((&stack0xffffffffffefffd6)[uVar41] & 0x3f)) +
                   uVar15 + *(int *)(&stack0xffffffffffefffd0 + uVar41);
          iVar43 = uVar16 + iVar43 +
                   (int)((ulong)uVar30 * (ulong)uVar16 >> (bVar2 & 0x3f)) * (uint)uVar6;
          for (; uVar36 <= uVar47; uVar47 = uVar47 >> 8) {
            puVar23[-1] = (uchar)uVar47;
            puVar23 = puVar23 + -1;
          }
          iVar14 = (uint)*(ushort *)(&stack0xffffffffffefffd4 + lVar28) *
                   (int)((ulong)*(uint *)(&stack0xffffffffffefffcc + lVar28) * (ulong)uVar47 >>
                        ((&stack0xffffffffffefffd6)[lVar28] & 0x3f)) +
                   uVar47 + *(int *)(&stack0xffffffffffefffd0 + lVar28);
          *(uint *)(puVar23 + -4) =
               uVar40 + iVar34 +
               (int)((ulong)uVar44 * (ulong)uVar40 >> (bVar50 & 0x3f)) * (uint)uVar5;
          puVar23[-8] = (uchar)iVar43;
          puVar23[-7] = (uchar)((uint)iVar43 >> 8);
          puVar23[-6] = (uchar)((uint)iVar43 >> 0x10);
          puVar23[-5] = (uchar)((uint)iVar43 >> 0x18);
          puVar23[-0xc] = (uchar)iVar42;
          puVar23[-0xb] = (uchar)((uint)iVar42 >> 8);
          puVar23[-10] = (uchar)((uint)iVar42 >> 0x10);
          puVar23[-9] = (uchar)((uint)iVar42 >> 0x18);
          puVar23[-0x10] = (uchar)iVar14;
          puVar23[-0xf] = (uchar)((uint)iVar14 >> 8);
          puVar23[-0xe] = (uchar)((uint)iVar14 >> 0x10);
          puVar23[-0xd] = (uchar)((uint)iVar14 >> 0x18);
          __n = (long)puVar19 - (long)(puVar23 + -0x10);
          uVar47 = (uint)(pbVar20 + __n);
          *out_size = uVar47;
          *puVar17 = '\x01';
          puVar17[1] = (char)(pbVar20 + __n) + 0xf7;
          puVar17[2] = (uchar)(uVar47 + 0xfff7 >> 8);
          puVar17[3] = (uchar)(uVar47 + 0xfffff7 >> 0x10);
          puVar17[4] = (uchar)(uVar47 - 9 >> 0x18);
          puVar17[5] = (uchar)in_size;
          puVar17[6] = (uchar)(in_size >> 8);
          puVar17[7] = (uchar)(in_size >> 0x10);
          puVar17[8] = (uchar)(in_size >> 0x18);
          memmove(puVar17 + ((uint)pbVar20 & 0x3ffff),puVar23 + -0x10,__n);
          return puVar17;
        }
      }
    }
  }
LAB_001380e2:
  __assert_fail("sym->x_max != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                ,0x10f,"void RansEncPutSymbol(RansState *, uint8_t **, const RansEncSymbol *)");
}

Assistant:

unsigned char *rans_compress_O1(unsigned char *in, unsigned int in_size,
				unsigned int *out_size) {
    unsigned char *out_buf, *out_end, *cp;
    unsigned int last_i, tab_size, rle_i, rle_j;
    RansEncSymbol syms[256][256];

    if (in_size < 4)
	return rans_compress_O0(in, in_size, out_size);

    out_buf = malloc(1.05*in_size + 257*257*3 + 9);
    if (!out_buf)
	return NULL;

    out_end = out_buf + (int)(1.05*in_size) + 257*257*3 + 9;
    cp = out_buf+9;

    int F[256][256], T[256], i, j;
    unsigned char c;

    memset(F, 0, 256*256*sizeof(int));
    memset(T, 0, 256*sizeof(int));
    //for (last = 0, i=in_size-1; i>=0; i--) {
    //	F[last][c = in[i]]++;
    //	T[last]++;
    //	last = c;
    //}

    for (last_i=i=0; i<in_size; i++) {
	F[last_i][c = in[i]]++;
	T[last_i]++;
	last_i = c;
    }
    F[0][in[1*(in_size>>2)]]++;
    F[0][in[2*(in_size>>2)]]++;
    F[0][in[3*(in_size>>2)]]++;
    T[0]+=3;

    // Normalise so T[i] == TOTFREQ
    for (rle_i = i = 0; i < 256; i++) {
	int t2, m, M;
	unsigned int x;

	if (T[i] == 0)
	    continue;

	//uint64_t p = (TOTFREQ * TOTFREQ) / t;
	double p = ((double)TOTFREQ)/T[i];
	for (t2 = m = M = j = 0; j < 256; j++) {
	    if (!F[i][j])
		continue;

	    if (m < F[i][j])
		m = F[i][j], M = j;

	    //if ((F[i][j] = (F[i][j] * p) / TOTFREQ) == 0)
	    if ((F[i][j] *= p) == 0)
		F[i][j] = 1;
	    t2 += F[i][j];
	}

	t2++;
	if (t2 < TOTFREQ)
	    F[i][M] += TOTFREQ-t2;
	else
	    F[i][M] -= t2-TOTFREQ;

	// Store frequency table
	// i
	if (rle_i) {
	    rle_i--;
	} else {
	    *cp++ = i;
	    // FIXME: could use order-0 statistics to observe which alphabet
	    // symbols are present and base RLE on that ordering instead.
	    if (i && T[i-1]) {
		for(rle_i=i+1; rle_i<256 && T[rle_i]; rle_i++)
		    ;
		rle_i -= i+1;
		*cp++ = rle_i;
	    }
	}

	int *F_i_ = F[i];
	x = 0;
	rle_j = 0;
	for (j = 0; j < 256; j++) {
	    if (F_i_[j]) {
		//fprintf(stderr, "F[%d][%d]=%d, x=%d\n", i, j, F_i_[j], x);

		// j
		if (rle_j) {
		    rle_j--;
		} else {
		    *cp++ = j;
		    if (!rle_j && j && F_i_[j-1]) {
			for(rle_j=j+1; rle_j<256 && F_i_[rle_j]; rle_j++)
			    ;
			rle_j -= j+1;
			*cp++ = rle_j;
		    }
		}

		// F_i_[j]
		if (F_i_[j]<128) {
		    *cp++ = F_i_[j];
		} else {
		    *cp++ = 128 | (F_i_[j]>>8);
		    *cp++ = F_i_[j]&0xff;
		}

		RansEncSymbolInit(&syms[i][j], x, F_i_[j], TF_SHIFT);
		x += F_i_[j];
	    }
	}
	*cp++ = 0;
    }
    *cp++ = 0;

    //write(1, out_buf+4, cp-(out_buf+4));
    tab_size = cp - out_buf;
    assert(tab_size < 257*257*3);

    RansState rans0, rans1, rans2, rans3;
    RansEncInit(&rans0);
    RansEncInit(&rans1);
    RansEncInit(&rans2);
    RansEncInit(&rans3);

    uint8_t* ptr = out_end;

    int isz4 = in_size>>2;
    int i0 = 1*isz4-2;
    int i1 = 2*isz4-2;
    int i2 = 3*isz4-2;
    int i3 = 4*isz4-2;

    unsigned char l0 = in[i0+1];
    unsigned char l1 = in[i1+1];
    unsigned char l2 = in[i2+1];
    unsigned char l3 = in[i3+1];

    // Deal with the remainder
    l3 = in[in_size-1];
    for (i3 = in_size-2; i3 > 4*isz4-2; i3--) {
	unsigned char c3 = in[i3];
	RansEncPutSymbol(&rans3, &ptr, &syms[c3][l3]);
	l3 = c3;
    }

    for (; i0 >= 0; i0--, i1--, i2--, i3--) {
	unsigned char c0, c1, c2, c3;
	RansEncSymbol *s3 = &syms[c3 = in[i3]][l3];
	RansEncSymbol *s2 = &syms[c2 = in[i2]][l2];
	RansEncSymbol *s1 = &syms[c1 = in[i1]][l1];
	RansEncSymbol *s0 = &syms[c0 = in[i0]][l0];

	RansEncPutSymbol(&rans3, &ptr, s3);
	RansEncPutSymbol(&rans2, &ptr, s2);
	RansEncPutSymbol(&rans1, &ptr, s1);
	RansEncPutSymbol(&rans0, &ptr, s0);

	l0 = c0;
	l1 = c1;
	l2 = c2;
	l3 = c3;
    }

    RansEncPutSymbol(&rans3, &ptr, &syms[0][l3]);
    RansEncPutSymbol(&rans2, &ptr, &syms[0][l2]);
    RansEncPutSymbol(&rans1, &ptr, &syms[0][l1]);
    RansEncPutSymbol(&rans0, &ptr, &syms[0][l0]);

    RansEncFlush(&rans3, &ptr);
    RansEncFlush(&rans2, &ptr);
    RansEncFlush(&rans1, &ptr);
    RansEncFlush(&rans0, &ptr);

    *out_size = (out_end - ptr) + tab_size;

    cp = out_buf;
    *cp++ = 1; // order

    *cp++ = ((*out_size-9)>> 0) & 0xff;
    *cp++ = ((*out_size-9)>> 8) & 0xff;
    *cp++ = ((*out_size-9)>>16) & 0xff;
    *cp++ = ((*out_size-9)>>24) & 0xff;

    *cp++ = (in_size>> 0) & 0xff;
    *cp++ = (in_size>> 8) & 0xff;
    *cp++ = (in_size>>16) & 0xff;
    *cp++ = (in_size>>24) & 0xff;

    memmove(out_buf + tab_size, ptr, out_end-ptr);

    return out_buf;
}